

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockStrictOrderTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MockStrictOrderTest_orderNotViolatedAcrossScopes_TestShell::createTest
          (TEST_MockStrictOrderTest_orderNotViolatedAcrossScopes_TestShell *this)

{
  Utest *this_00;
  TEST_MockStrictOrderTest_orderNotViolatedAcrossScopes_TestShell *this_local;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockStrictOrderTest.cpp"
                                  ,0x99);
  TEST_MockStrictOrderTest_orderNotViolatedAcrossScopes_Test::
  TEST_MockStrictOrderTest_orderNotViolatedAcrossScopes_Test
            ((TEST_MockStrictOrderTest_orderNotViolatedAcrossScopes_Test *)this_00);
  return this_00;
}

Assistant:

TEST(MockStrictOrderTest, orderNotViolatedAcrossScopes)
{
    mock("mock1").strictOrder();
    mock("mock2").strictOrder();

    mock("mock1").expectOneCall("foo1");
    mock("mock2").expectOneCall("foo2");
    mock("mock1").actualCall("foo1");
    mock("mock2").actualCall("foo2");

    mock("mock1").checkExpectations();
    mock("mock2").checkExpectations();
}